

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::internalRaise(QMdiAreaPrivate *this,QMdiSubWindow *mdiChild)

{
  QObject **ppQVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QWidget *local_60;
  QWidget *local_58;
  QArrayDataPointer<QObject_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = (QWidget *)0x65f7d6;
  bVar2 = sanityCheck(mdiChild,"QMdiArea::internalRaise");
  if ((bVar2) && (1 < (ulong)(this->childWindows).d.size)) {
    if ((mdiChild == (QMdiSubWindow *)0x0) ||
       (((((mdiChild->super_QWidget).data)->window_flags).
         super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i &
        0x40000) == 0)) {
      lVar3 = *(long *)&((this->super_QAbstractScrollAreaPrivate).viewport)->field_0x8;
      local_50.d = *(Data **)(lVar3 + 0x18);
      ppQVar1 = *(QObject ***)(lVar3 + 0x20);
      local_50.size = *(long *)(lVar3 + 0x28);
      if (local_50.d != (Data *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar3 = local_50.size * 8;
      local_60 = (QWidget *)0x0;
      local_50.ptr = ppQVar1;
      for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 8) {
        local_58 = &QtPrivate::qobject_cast_helper<QMdiSubWindow*,QObject>
                              (*(QObject **)((long)ppQVar1 + lVar4))->super_QWidget;
        if (local_58 != (QWidget *)0x0) {
          bVar2 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::contains<QMdiSubWindow*>
                            ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>> *)&this->childWindows
                             ,(QMdiSubWindow **)&local_58);
          if (bVar2) {
            if (((local_58->data->widget_attributes & 0x10000) == 0) &&
               (((local_58->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                 super_QFlagsStorage<Qt::WindowType>.i & 0x40000) != 0)) {
              if (local_60 == (QWidget *)0x0) {
                QWidget::raise(local_58,0);
              }
              else {
                QWidget::stackUnder(local_58,local_60);
              }
              local_60 = local_58;
            }
          }
        }
      }
      QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_50);
      if (local_60 != (QWidget *)0x0) {
        QWidget::stackUnder(&mdiChild->super_QWidget,local_60);
        goto LAB_0040bb7b;
      }
    }
    QWidget::raise(&mdiChild->super_QWidget,(int)local_60);
  }
LAB_0040bb7b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::internalRaise(QMdiSubWindow *mdiChild) const
{
    if (!sanityCheck(mdiChild, "QMdiArea::internalRaise") || childWindows.size() < 2)
        return;

    QMdiSubWindow *stackUnderChild = nullptr;
    if (!windowStaysOnTop(mdiChild)) {
        const auto children = viewport->children(); // take a copy, as raising/stacking under changes the order
        for (QObject *object : children) {
            QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(object);
            if (!child || !childWindows.contains(child))
                continue;
            if (!child->isHidden() && windowStaysOnTop(child)) {
                if (stackUnderChild)
                    child->stackUnder(stackUnderChild);
                else
                    child->raise();
                stackUnderChild = child;
            }
        }
    }

    if (stackUnderChild)
        mdiChild->stackUnder(stackUnderChild);
    else
        mdiChild->raise();
}